

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_print_stat(REF_HISTOGRAM ref_histogram)

{
  double dVar1;
  double dVar2;
  double local_68;
  double local_58;
  double local_50;
  double local_40;
  REF_DBL d;
  REF_DBL n;
  REF_DBL kurtosis;
  REF_DBL skewness;
  REF_INT i;
  REF_HISTOGRAM ref_histogram_local;
  
  printf("mom ");
  for (skewness._4_4_ = 0; (int)skewness._4_4_ < ref_histogram->nstat;
      skewness._4_4_ = skewness._4_4_ + 1) {
    printf("%12.8f(%d)",ref_histogram->stats[(int)skewness._4_4_],(ulong)skewness._4_4_);
  }
  printf("\n");
  dVar1 = ref_histogram->stats[3];
  dVar2 = pow(ref_histogram->stats[2],1.5);
  kurtosis = 0.0;
  if (dVar2 * 1e+20 <= 0.0) {
    local_40 = -(dVar2 * 1e+20);
  }
  else {
    local_40 = dVar2 * 1e+20;
  }
  local_50 = dVar1;
  if (dVar1 <= 0.0) {
    local_50 = -dVar1;
  }
  if (local_50 < local_40) {
    kurtosis = dVar1 / dVar2;
  }
  dVar1 = ref_histogram->stats[4];
  dVar2 = pow(ref_histogram->stats[2],2.0);
  n = 0.0;
  if (dVar2 * 1e+20 <= 0.0) {
    local_58 = -(dVar2 * 1e+20);
  }
  else {
    local_58 = dVar2 * 1e+20;
  }
  local_68 = dVar1;
  if (dVar1 <= 0.0) {
    local_68 = -dVar1;
  }
  if (local_68 < local_58) {
    n = dVar1 / dVar2 - 3.0;
  }
  printf("skewness %12.8f kurtosis %12.8f\n",kurtosis,n);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_print_stat(REF_HISTOGRAM ref_histogram) {
  REF_INT i;
  REF_DBL skewness, kurtosis, n, d;

  printf("mom ");
  for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
    printf("%12.8f(%d)", ref_histogram_stat(ref_histogram, i), i);
  printf("\n");

  n = ref_histogram_stat(ref_histogram, 3);
  d = pow(ref_histogram_stat(ref_histogram, 2), 1.5);
  skewness = 0.0;
  if (ref_math_divisible(n, d)) skewness = n / d;

  n = ref_histogram_stat(ref_histogram, 4);
  d = pow(ref_histogram_stat(ref_histogram, 2), 2);
  kurtosis = 0.0;
  if (ref_math_divisible(n, d)) kurtosis = n / d - 3.0;

  printf("skewness %12.8f kurtosis %12.8f\n", skewness, kurtosis);

  return REF_SUCCESS;
}